

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O1

FxExpression * ParseMinMax(FScanner *sc,FName *identifier,PClassActor *cls)

{
  bool bVar1;
  FxExpression *pFVar2;
  FxMinMax *this;
  TArray<FxExpression_*,_FxExpression_*> list;
  FName local_5c;
  TArray<FxExpression_*,_FxExpression_*> local_58;
  FScriptPosition local_40;
  
  local_58.Array = (FxExpression **)0x0;
  local_58.Most = 0;
  local_58.Count = 0;
  do {
    pFVar2 = ParseExpressionM(sc,cls);
    TArray<FxExpression_*,_FxExpression_*>::Grow(&local_58,1);
    local_58.Array[local_58.Count] = pFVar2;
    local_58.Count = local_58.Count + 1;
    bVar1 = FScanner::CheckToken(sc,0x29);
    if (bVar1) break;
    FScanner::MustGetToken(sc,0x2c);
  } while (!bVar1);
  this = (FxMinMax *)operator_new(0x50);
  local_5c = (FName)identifier->Index;
  FScriptPosition::FScriptPosition(&local_40,sc);
  FxMinMax::FxMinMax(this,&local_58,&local_5c,&local_40);
  FString::~FString(&local_40.FileName);
  TArray<FxExpression_*,_FxExpression_*>::~TArray(&local_58);
  return &this->super_FxExpression;
}

Assistant:

static FxExpression *ParseMinMax(FScanner &sc, FName identifier, PClassActor *cls)
{
	TArray<FxExpression*> list;
	for (;;)
	{
		FxExpression *expr = ParseExpressionM(sc, cls);
		list.Push(expr);
		if (sc.CheckToken(')'))
			break;
		sc.MustGetToken(',');
	}
	return new FxMinMax(list, identifier, sc);
}